

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uid.cpp
# Opt level: O0

string * fs_get_terminal_abi_cxx11_(void)

{
  string *in_RDI;
  string_view local_20;
  
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_20,"TERM");
  fs_getenv_abi_cxx11_(in_RDI,local_20);
  return in_RDI;
}

Assistant:

std::string fs_get_terminal()
{
#ifdef _WIN32
  std::string name(fs_get_max_path(), '\0');
  // inspired by https://gitlab.kitware.com/utils/kwsys/-/commit/0d6eac1feb8615fe59e8f972d41d1eaa8bc9baf8
  // Windows Console Host: ConsoleWindowClass
  // Windows Terminal / ConPTY: PseudoConsoleWindow (undocumented)

  // https://learn.microsoft.com/en-us/windows/console/getconsolewindow
  // encourages Virtual Terminal Sequences

  //  The `GetConsoleWindow()` API returns a window handle (HWND), but it should not be closed by the application.
  // This handle is owned and managed by the system, so calling CloseWindow() on it could
  // disrupt the console window's operation.

  if (HWND h = GetConsoleWindow(); h) {
    int L = GetClassNameA(h, name.data(), static_cast<int>(name.size()));

    if (L > 0){
      name.resize(L);
      return name;
    }
  }

  fs_print_error("", __func__);
  return {};
#else
  return fs_getenv("TERM");
#endif

}